

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O2

char __thiscall Buffer::consume(Buffer *this,char c)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  char cVar4;
  undefined7 in_register_00000031;
  char *condition;
  char *pcVar5;
  undefined1 local_40 [8];
  unique_lock<std::mutex> lock;
  
  uVar2 = CONCAT71(in_register_00000031,c) & 0xffffffff;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_40,&this->mutex);
  pcVar5 = "First element is other";
  if (this->position < 4) {
    pcVar5 = "Less than 3 elements";
  }
  cVar4 = (char)uVar2;
  if ((this->position < 4) || (this->buffer[0] != cVar4)) {
    printf("Consumer %c waits (%s)\n",uVar2,pcVar5);
    while ((this->position < 4 || (this->buffer[0] != cVar4))) {
      std::condition_variable::wait((unique_lock *)&this->cond);
    }
    printf("Consumer %c consumes after waiting (%s)\n",uVar2,pcVar5);
  }
  else {
    printf("Consumer %c consumes\n",uVar2);
  }
  uVar1 = this->position - 1;
  uVar2 = 0;
  uVar3 = 0;
  if (0 < (int)uVar1) {
    uVar3 = (ulong)uVar1;
  }
  for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    this->buffer[uVar2] = this->buffer[uVar2 + 1];
  }
  this->position = uVar1;
  printBuffer(this);
  std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)local_40);
  std::condition_variable::notify_all();
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_40);
  return cVar4;
}

Assistant:

char Buffer::consume(char c) {
    std::unique_lock<std::mutex> lock(mutex);

    const bool lessThan3Elements = !isMoreThan3Elements();
    const bool isFirstElementOther = !isFirstElement(c);
    if (lessThan3Elements || isFirstElementOther) {
        const char *const condition = lessThan3Elements ? LESS_THAN_3_ELEMENTS : FIRST_ELEMENT_OTHER;
        printf("Consumer %c waits (%s)\n", c, condition);

        cond.wait(lock, [this, c]() -> bool { return isMoreThan3Elements() && isFirstElement(c); });

        printf("Consumer %c consumes after waiting (%s)\n", c, condition);
    } else {
        printf("Consumer %c consumes\n", c);
    }

    for (int i = 0; i < position - 1; ++i) {
        buffer[i] = buffer[i + 1];
    }
    --position;
    printBuffer();

    lock.unlock();
    cond.notify_all();
    return c;
}